

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testWav.cpp
# Opt level: O3

void anon_unknown.dwarf_34db32::test(int nx,int ny)

{
  ulong uVar1;
  ulong uVar2;
  size_t __n;
  ushort uVar3;
  unsigned_short uVar4;
  ostream *this;
  long *plVar5;
  unsigned_short *puVar6;
  unsigned_short *puVar7;
  unsigned_short *puVar8;
  unsigned_short *puVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  Array2D<unsigned_short> b;
  Array2D<unsigned_short> a;
  Rand48 rand48;
  Array2D<unsigned_short> local_68;
  Array2D<unsigned_short> local_50;
  ushort local_36 [3];
  
  uVar1 = (ulong)(uint)ny;
  uVar2 = (ulong)(uint)nx;
  this = (ostream *)std::ostream::operator<<(&std::cout,nx);
  std::__ostream_insert<char,std::char_traits<char>>(this," x ",3);
  plVar5 = (long *)std::ostream::operator<<(this,ny);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  __n = uVar2 * 2;
  local_50._sizeX = uVar1;
  local_50._sizeY = uVar2;
  puVar6 = (unsigned_short *)operator_new__(__n * uVar1);
  local_68._sizeX = uVar1;
  local_68._sizeY = uVar2;
  local_50._data = puVar6;
  puVar7 = (unsigned_short *)operator_new__(__n * uVar1);
  local_36[0] = 0x5a5a;
  local_36[1] = 0x5a5a;
  local_36[2] = 0x5a5a;
  local_68._data = puVar7;
  if (0 < ny) {
    uVar12 = 0;
    puVar8 = puVar7;
    puVar9 = puVar6;
    do {
      if (0 < nx) {
        uVar11 = 0;
        do {
          uVar3 = Imath_3_2::nrand48(local_36);
          puVar8[uVar11] = uVar3 & 0x3fff;
          puVar9[uVar11] = uVar3 & 0x3fff;
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
      uVar12 = uVar12 + 1;
      puVar9 = puVar9 + uVar2;
      puVar8 = puVar8 + uVar2;
    } while (uVar12 != uVar1);
  }
  wavEncodeDecode(&local_50,&local_68,nx,ny);
  if (0 < ny) {
    uVar12 = 0;
    puVar8 = puVar6;
    puVar9 = puVar7;
    do {
      if (0 < nx) {
        uVar11 = 0;
        do {
          uVar4 = Imath_3_2::nrand48(local_36);
          puVar9[uVar11] = uVar4;
          puVar8[uVar11] = uVar4;
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
      uVar12 = uVar12 + 1;
      puVar8 = puVar8 + uVar2;
      puVar9 = puVar9 + uVar2;
    } while (uVar12 != uVar1);
  }
  wavEncodeDecode(&local_50,&local_68,nx,ny);
  if (0 < ny) {
    lVar10 = 0;
    uVar12 = uVar1;
    do {
      if (0 < nx) {
        memset((void *)((long)puVar7 + lVar10),0,__n);
        memset((void *)((long)puVar6 + lVar10),0,__n);
      }
      lVar10 = lVar10 + __n;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  wavEncodeDecode(&local_50,&local_68,nx,ny);
  if (0 < ny) {
    uVar12 = 0;
    puVar8 = puVar7;
    puVar9 = puVar6;
    do {
      if (0 < nx) {
        uVar11 = 0;
        do {
          puVar8[uVar11] = 1;
          puVar9[uVar11] = 1;
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
      uVar12 = uVar12 + 1;
      puVar9 = puVar9 + uVar2;
      puVar8 = puVar8 + uVar2;
    } while (uVar12 != uVar1);
  }
  wavEncodeDecode(&local_50,&local_68,nx,ny);
  if (0 < ny) {
    uVar12 = 0;
    puVar8 = puVar7;
    puVar9 = puVar6;
    do {
      if (0 < nx) {
        uVar11 = 0;
        do {
          puVar8[uVar11] = 0x3ffe;
          puVar9[uVar11] = 0x3ffe;
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
      uVar12 = uVar12 + 1;
      puVar9 = puVar9 + uVar2;
      puVar8 = puVar8 + uVar2;
    } while (uVar12 != uVar1);
  }
  wavEncodeDecode(&local_50,&local_68,nx,ny);
  if (0 < ny) {
    uVar12 = 0;
    puVar8 = puVar7;
    puVar9 = puVar6;
    do {
      if (0 < nx) {
        uVar11 = 0;
        do {
          puVar8[uVar11] = 0x3fff;
          puVar9[uVar11] = 0x3fff;
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
      uVar12 = uVar12 + 1;
      puVar9 = puVar9 + uVar2;
      puVar8 = puVar8 + uVar2;
    } while (uVar12 != uVar1);
  }
  wavEncodeDecode(&local_50,&local_68,nx,ny);
  if (0 < ny) {
    uVar12 = 0;
    puVar8 = puVar7;
    puVar9 = puVar6;
    do {
      if (0 < nx) {
        uVar11 = 0;
        do {
          puVar8[uVar11] = 0xfffe;
          puVar9[uVar11] = 0xfffe;
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
      uVar12 = uVar12 + 1;
      puVar9 = puVar9 + uVar2;
      puVar8 = puVar8 + uVar2;
    } while (uVar12 != uVar1);
  }
  wavEncodeDecode(&local_50,&local_68,nx,ny);
  if (0 < ny) {
    lVar10 = 0;
    uVar12 = uVar1;
    do {
      if (0 < nx) {
        memset((void *)((long)puVar7 + lVar10),0xff,__n);
        memset((void *)((long)puVar6 + lVar10),0xff,__n);
      }
      lVar10 = lVar10 + __n;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  wavEncodeDecode(&local_50,&local_68,nx,ny);
  if (0 < ny) {
    uVar12 = 0;
    puVar8 = puVar7;
    puVar9 = puVar6;
    do {
      if (0 < nx) {
        uVar11 = 0;
        do {
          uVar4 = 0;
          if ((uVar11 & 1) == 0) {
            uVar4 = 0x3fff;
          }
          puVar8[uVar11] = uVar4;
          puVar9[uVar11] = uVar4;
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
      uVar12 = uVar12 + 1;
      puVar9 = puVar9 + uVar2;
      puVar8 = puVar8 + uVar2;
    } while (uVar12 != uVar1);
  }
  wavEncodeDecode(&local_50,&local_68,nx,ny);
  if (0 < ny) {
    uVar12 = 0;
    puVar8 = puVar7;
    puVar9 = puVar6;
    do {
      if (0 < nx) {
        uVar11 = 0;
        do {
          uVar4 = ((ushort)uVar11 & 1) - 1;
          puVar8[uVar11] = uVar4;
          puVar9[uVar11] = uVar4;
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
      uVar12 = uVar12 + 1;
      puVar9 = puVar9 + uVar2;
      puVar8 = puVar8 + uVar2;
    } while (uVar12 != uVar1);
  }
  wavEncodeDecode(&local_50,&local_68,nx,ny);
  if (0 < ny) {
    uVar12 = 0;
    puVar8 = puVar7;
    puVar9 = puVar6;
    do {
      if (0 < nx) {
        uVar4 = 0;
        if ((uVar12 & 1) == 0) {
          uVar4 = 0x3fff;
        }
        uVar11 = 0;
        do {
          puVar8[uVar11] = uVar4;
          puVar9[uVar11] = uVar4;
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
      uVar12 = uVar12 + 1;
      puVar9 = puVar9 + uVar2;
      puVar8 = puVar8 + uVar2;
    } while (uVar12 != uVar1);
  }
  wavEncodeDecode(&local_50,&local_68,nx,ny);
  if (0 < ny) {
    uVar12 = 0;
    puVar8 = puVar7;
    puVar9 = puVar6;
    do {
      if (0 < nx) {
        uVar4 = ((ushort)uVar12 & 1) - 1;
        uVar11 = 0;
        do {
          puVar8[uVar11] = uVar4;
          puVar9[uVar11] = uVar4;
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
      uVar12 = uVar12 + 1;
      puVar9 = puVar9 + uVar2;
      puVar8 = puVar8 + uVar2;
    } while (uVar12 != uVar1);
  }
  wavEncodeDecode(&local_50,&local_68,nx,ny);
  if (0 < ny) {
    uVar12 = 0;
    puVar8 = puVar7;
    puVar9 = puVar6;
    do {
      if (0 < nx) {
        uVar11 = 0;
        do {
          uVar4 = 0x3fff;
          if (((int)uVar12 + (int)uVar11 & 1U) != 0) {
            uVar4 = 0;
          }
          puVar8[uVar11] = uVar4;
          puVar9[uVar11] = uVar4;
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
      uVar12 = uVar12 + 1;
      puVar9 = puVar9 + uVar2;
      puVar8 = puVar8 + uVar2;
    } while (uVar12 != uVar1);
  }
  wavEncodeDecode(&local_50,&local_68,nx,ny);
  if (0 < ny) {
    uVar12 = 0;
    puVar8 = puVar7;
    puVar9 = puVar6;
    do {
      if (0 < nx) {
        uVar11 = 0;
        do {
          uVar4 = ((short)uVar12 + (short)uVar11 & 1U) - 1;
          puVar8[uVar11] = uVar4;
          puVar9[uVar11] = uVar4;
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
      uVar12 = uVar12 + 1;
      puVar9 = puVar9 + uVar2;
      puVar8 = puVar8 + uVar2;
    } while (uVar12 != uVar1);
  }
  wavEncodeDecode(&local_50,&local_68,nx,ny);
  operator_delete__(puVar7);
  operator_delete__(puVar6);
  return;
}

Assistant:

void
test (int nx, int ny)
{
    cout << nx << " x " << ny << endl;

    Array2D<unsigned short> a (ny, nx);
    Array2D<unsigned short> b (ny, nx);

    IMATH_NAMESPACE::Rand48 rand48 (0);

    fill1_14bit (a, b, nx, ny, rand48);
    wavEncodeDecode (a, b, nx, ny);

    fill1_16bit (a, b, nx, ny, rand48);
    wavEncodeDecode (a, b, nx, ny);

    fill2 (a, b, nx, ny, 0);
    wavEncodeDecode (a, b, nx, ny);

    fill2 (a, b, nx, ny, 1);
    wavEncodeDecode (a, b, nx, ny);

    fill2 (a, b, nx, ny, 0x3ffe);
    wavEncodeDecode (a, b, nx, ny);

    fill2 (a, b, nx, ny, 0x3fff);
    wavEncodeDecode (a, b, nx, ny);

    fill2 (a, b, nx, ny, 0xfffe);
    wavEncodeDecode (a, b, nx, ny);

    fill2 (a, b, nx, ny, 0xffff);
    wavEncodeDecode (a, b, nx, ny);

    fill3_14bit (a, b, nx, ny);
    wavEncodeDecode (a, b, nx, ny);

    fill3_16bit (a, b, nx, ny);
    wavEncodeDecode (a, b, nx, ny);

    fill4_14bit (a, b, nx, ny);
    wavEncodeDecode (a, b, nx, ny);

    fill4_16bit (a, b, nx, ny);
    wavEncodeDecode (a, b, nx, ny);

    fill5_14bit (a, b, nx, ny);
    wavEncodeDecode (a, b, nx, ny);

    fill5_16bit (a, b, nx, ny);
    wavEncodeDecode (a, b, nx, ny);
}